

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack11_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x7ff) + base;
  out[1] = (*in >> 0xb & 0x7ff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x16;
  out[2] = (uVar1 >> 0x16) + base + (in[1] & 1) * 0x400;
  out[3] = (in[1] >> 1 & 0x7ff) + base;
  out[4] = (in[1] >> 0xc & 0x7ff) + base;
  uVar1 = in[1];
  out[5] = uVar1 >> 0x17;
  out[5] = (uVar1 >> 0x17) + base + (in[2] & 3) * 0x200;
  out[6] = (in[2] >> 2 & 0x7ff) + base;
  out[7] = (in[2] >> 0xd & 0x7ff) + base;
  return in + 3;
}

Assistant:

uint32_t * unpack11_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 11 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  11  )   % (1U << 11 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 11 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 11 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 11 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 11 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 11 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 11 )  ;
    *out += base;
    out++;

    return in + 1;
}